

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_read_image.cxx
# Opt level: O0

void write_image_inside(Fl_RGB_Image *to,Fl_RGB_Image *from,int to_x,int to_y)

{
  uchar *puVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int local_4c;
  int local_44;
  int local_40;
  int local_3c;
  int j;
  int i;
  uchar *frombytes;
  uchar *tobytes;
  int from_ld;
  int to_ld;
  int to_y_local;
  int to_x_local;
  Fl_RGB_Image *from_local;
  Fl_RGB_Image *to_local;
  
  iVar2 = Fl_Image::ld(&to->super_Fl_Image);
  if (iVar2 == 0) {
    local_44 = Fl_Image::w(&to->super_Fl_Image);
    iVar2 = Fl_Image::d(&to->super_Fl_Image);
    local_44 = local_44 * iVar2;
  }
  else {
    local_44 = Fl_Image::ld(&to->super_Fl_Image);
  }
  iVar2 = Fl_Image::ld(&from->super_Fl_Image);
  if (iVar2 == 0) {
    local_4c = Fl_Image::w(&from->super_Fl_Image);
    iVar2 = Fl_Image::d(&from->super_Fl_Image);
    local_4c = local_4c * iVar2;
  }
  else {
    local_4c = Fl_Image::ld(&from->super_Fl_Image);
  }
  puVar1 = to->array;
  iVar2 = Fl_Image::d(&to->super_Fl_Image);
  frombytes = puVar1 + (long)(to_x * iVar2) + (long)(to_y * local_44);
  _j = from->array;
  iVar2 = Fl_Image::h(&from->super_Fl_Image);
  _j = _j + (iVar2 + -1) * local_4c;
  local_3c = Fl_Image::h(&from->super_Fl_Image);
  while (local_3c = local_3c + -1, -1 < local_3c) {
    iVar2 = Fl_Image::d(&from->super_Fl_Image);
    iVar3 = Fl_Image::d(&to->super_Fl_Image);
    if (iVar2 == iVar3) {
      iVar2 = Fl_Image::w(&from->super_Fl_Image);
      iVar3 = Fl_Image::d(&from->super_Fl_Image);
      memcpy(frombytes,_j,(long)(iVar2 * iVar3));
    }
    else {
      for (local_40 = 0; iVar2 = Fl_Image::w(&from->super_Fl_Image), local_40 < iVar2;
          local_40 = local_40 + 1) {
        iVar2 = Fl_Image::d(&to->super_Fl_Image);
        iVar3 = Fl_Image::d(&from->super_Fl_Image);
        iVar4 = Fl_Image::d(&from->super_Fl_Image);
        memcpy(frombytes + local_40 * iVar2,_j + local_40 * iVar3,(long)iVar4);
      }
    }
    frombytes = frombytes + local_44;
    _j = _j + -(long)local_4c;
  }
  return;
}

Assistant:

static void write_image_inside(Fl_RGB_Image *to, Fl_RGB_Image *from, int to_x, int to_y)
/* Copy the image "from" inside image "to" with its top-left angle at coordinates to_x, to_y.
 Also, exchange top and bottom of "from". Image depth can differ between "to" and "from".
 */
{
  int to_ld = (to->ld() == 0? to->w() * to->d() : to->ld());
  int from_ld = (from->ld() == 0? from->w() * from->d() : from->ld());
  uchar *tobytes = (uchar*)to->array + to_y * to_ld + to_x * to->d();
  const uchar *frombytes = from->array + (from->h() - 1) * from_ld;
  for (int i = from->h() - 1; i >= 0; i--) {
    if (from->d() == to->d()) memcpy(tobytes, frombytes, from->w() * from->d());
    else {
      for (int j = 0; j < from->w(); j++) {
        memcpy(tobytes + j * to->d(), frombytes + j * from->d(), from->d());
      }
    }
    tobytes += to_ld;
    frombytes -= from_ld;
  }
}